

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwTestNow(char *file,int line,int always_invoked)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  mwData *pmVar8;
  mwData *pmVar9;
  
  if (always_invoked == 0 && file != (char *)0x0) {
    pcVar6 = "chain ";
    if ((mwTestFlags & 1U) == 0) {
      pcVar6 = "";
    }
    pcVar7 = "alloc ";
    if ((mwTestFlags & 2U) == 0) {
      pcVar7 = "";
    }
    pcVar2 = "nomansland ";
    if ((mwTestFlags & 4U) == 0) {
      pcVar2 = "";
    }
    mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",mwCounter,file,line,pcVar6,pcVar7,pcVar2);
  }
  iVar4 = 0;
  if (mwHead != (mwData *)0x0 && (mwTestFlags & 1U) != 0) {
    iVar4 = 0;
    pmVar8 = mwHead;
    do {
      uVar5 = 0;
      if (mwDataSize != '\0') {
        uVar5 = 0x38;
      }
      iVar1 = mwIsSafeAddr(pmVar8,uVar5);
      if (iVar1 == 0) {
LAB_00106df8:
        if (always_invoked != 0) {
          mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
        }
        mwWrite("check: heap corruption detected\n");
        mwErrors = mwErrors + 1;
        iVar1 = mwFlushR();
        mwFlushingB2 = iVar1 + 1;
        mwFlushingB1 = mwFlushingB2;
        mwFlushing = mwFlushingB2;
        mwFlush();
        return iVar4 + 1;
      }
      if (pmVar8->prev != (mwData *)0x0) {
        uVar5 = 0;
        if (mwDataSize != '\0') {
          uVar5 = 0x38;
        }
        iVar1 = mwIsSafeAddr(pmVar8->prev,uVar5);
        if (iVar1 == 0) goto LAB_00106df8;
        if ((pmVar8 == mwHead) || (pmVar8->prev->next != pmVar8)) {
          if (always_invoked != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
          }
          always_invoked = 0;
          mwWrite("check: heap chain broken, prev link incorrect\n");
          mwErrors = mwErrors + 1;
          iVar1 = mwFlushR();
          mwFlushingB2 = iVar1 + 1;
          mwFlushingB1 = mwFlushingB2;
          mwFlushing = mwFlushingB2;
          mwFlush();
          iVar4 = iVar4 + 1;
        }
      }
      if (pmVar8->next == (mwData *)0x0) {
        if (pmVar8 != mwTail) {
          pcVar6 = "check: heap chain broken, tail incorrect\n";
LAB_00106c85:
          if (always_invoked != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
          }
          always_invoked = 0;
          mwWrite(pcVar6);
          mwErrors = mwErrors + 1;
          iVar1 = mwFlushR();
          mwFlushingB2 = iVar1 + 1;
          mwFlushingB1 = mwFlushingB2;
          mwFlushing = mwFlushingB2;
          mwFlush();
          iVar4 = iVar4 + 1;
        }
      }
      else {
        uVar5 = 0;
        if (mwDataSize != '\0') {
          uVar5 = 0x38;
        }
        iVar1 = mwIsSafeAddr(pmVar8->next,uVar5);
        if (iVar1 == 0) goto LAB_00106df8;
        if ((pmVar8 == mwTail) || (pmVar8->next->prev != pmVar8)) {
          pcVar6 = "check: heap chain broken, next link incorrect\n";
          goto LAB_00106c85;
        }
      }
      pmVar8 = pmVar8->next;
    } while (pmVar8 != (mwData *)0x0);
  }
  pmVar8 = mwHead;
  if (mwHead != (mwData *)0x0 && (mwTestFlags & 2U) != 0) {
    do {
      iVar1 = mwTestBuf(pmVar8,file,line);
      iVar4 = (iVar4 + 1) - (uint)(iVar1 == 0);
      pmVar8 = pmVar8->next;
    } while (pmVar8 != (mwData *)0x0);
  }
  pmVar8 = mwHead;
  if (mwHead != (mwData *)0x0 && (mwTestFlags & 4U) != 0) {
    do {
      if ((pmVar8->flag & 1) != 0) {
        pmVar9 = pmVar8 + 1;
        if (mwDataSize == '\0') {
          pmVar9 = pmVar8;
        }
        iVar1 = (int)pmVar8->size;
        if (iVar1 != 0) {
          lVar3 = 0;
          do {
            if (*(char *)((long)&pmVar9->next + lVar3) != -4) {
              mwErrors = mwErrors + 1;
              iVar1 = mwFlushR();
              mwFlushingB2 = iVar1 + 1;
              mwFlushingB1 = mwFlushingB2;
              mwFlushing = mwFlushingB2;
              mwFlush();
              mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",pmVar8->count,
                      &pmVar9->file,pmVar8->file,(ulong)(uint)pmVar8->line);
              break;
            }
            lVar3 = lVar3 + 1;
          } while (iVar1 != (int)lVar3);
        }
      }
      pmVar8 = pmVar8->next;
    } while (pmVar8 != (mwData *)0x0);
  }
  if (((file != (char *)0x0) && (always_invoked == 0)) && (iVar4 == 0)) {
    mwWrite("check: <%ld> %s(%d), complete; no errors\n",mwCounter,file,line);
  }
  return iVar4;
}

Assistant:

static int mwTestNow(const char *file, int line, int always_invoked)
{
	int retv = 0;
	mwData *mw;
	char *data;

	if (file && !always_invoked)
		mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",
				mwCounter, file, line,
				(mwTestFlags & MW_TEST_CHAIN) ? "chain " : "",
				(mwTestFlags & MW_TEST_ALLOC) ? "alloc " : "",
				(mwTestFlags & MW_TEST_NML) ? "nomansland " : ""
			   );

	if (mwTestFlags & MW_TEST_CHAIN) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (!mwIsSafeAddr(mw, mwDataSize)) {
				AIPH();
				mwWrite("check: heap corruption detected\n");
				mwIncErr();
				return retv + 1;
			}
			if (mw->prev) {
				if (!mwIsSafeAddr(mw->prev, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwHead || mw->prev->next != mw) {
					AIPH();
					mwWrite("check: heap chain broken, prev link incorrect\n");
					mwIncErr();
					retv ++;
				}
			}
			if (mw->next) {
				if (!mwIsSafeAddr(mw->next, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwTail || mw->next->prev != mw) {
					AIPH();
					mwWrite("check: heap chain broken, next link incorrect\n");
					mwIncErr();
					retv ++;
				}
			} else if (mw != mwTail) {
				AIPH();
				mwWrite("check: heap chain broken, tail incorrect\n");
				mwIncErr();
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_ALLOC) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (mwTestBuf(mw, file, line)) {
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_NML) {
		for (mw = mwHead; mw; mw = mw->next) {
			if ((mw->flag & MW_NML)) {
				data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
				if (mwTestMem(data, mw->size, MW_VAL_NML)) {
					mwIncErr();
					mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
							mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
				}
			}
		}
	}


	if (file && !always_invoked && !retv)
		mwWrite("check: <%ld> %s(%d), complete; no errors\n",
				mwCounter, file, line);
	return retv;
}